

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  PushRevertRpcRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_1b9;
  PushBatchGetDevicesInfoResponseType resp;
  string local_190;
  string local_170 [32];
  string local_150 [32];
  string local_130;
  PushPushByteMessageResponseType resp_1;
  PushBatchGetDevicesInfoRequestType req;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &req.devices.field_2;
  req.devices._M_string_length = 0;
  req.devices.field_2._M_local_buf[0] = '\0';
  paVar2 = &req.app_id.field_2;
  req.app_id._M_string_length = 0;
  req.app_id.field_2._M_local_buf[0] = '\0';
  resp.device_infos.
  super__Vector_base<aliyun::PushBatchGetDevicesInfoDeviceInfoType,_std::allocator<aliyun::PushBatchGetDevicesInfoDeviceInfoType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resp.device_infos.
  super__Vector_base<aliyun::PushBatchGetDevicesInfoDeviceInfoType,_std::allocator<aliyun::PushBatchGetDevicesInfoDeviceInfoType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resp.device_infos.
  super__Vector_base<aliyun::PushBatchGetDevicesInfoDeviceInfoType,_std::allocator<aliyun::PushBatchGetDevicesInfoDeviceInfoType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  req.devices._M_dataplus._M_p = (pointer)paVar1;
  req.app_id._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resp_1,"cn-hangzhou",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"my_appid",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"my_secret",&local_1b9);
  this = (PushRevertRpcRequestType *)aliyun::Push::CreatePushClient(&resp_1,local_150,local_170);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&resp_1);
  if (this == (PushRevertRpcRequestType *)0x0) {
    std::
    vector<aliyun::PushBatchGetDevicesInfoDeviceInfoType,_std::allocator<aliyun::PushBatchGetDevicesInfoDeviceInfoType>_>
    ::~vector(&resp.device_infos);
    aliyun::PushBatchGetDevicesInfoRequestType::~PushBatchGetDevicesInfoRequestType(&req);
    req.devices._M_string_length = 0;
    req.devices.field_2._M_local_buf[0] = '\0';
    req.app_id._M_string_length = 0;
    req.app_id.field_2._M_local_buf[0] = '\0';
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    paVar3 = &resp_1.response_id.field_2;
    resp_1.response_id._M_string_length = 0;
    resp_1.response_id.field_2._M_local_buf[0] = '\0';
    resp_1.response_id._M_dataplus._M_p = (pointer)paVar3;
    req.devices._M_dataplus._M_p = (pointer)paVar1;
    req.app_id._M_dataplus._M_p = (pointer)paVar2;
    local_90._M_p = (pointer)&local_80;
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::string<std::allocator<char>>
              (local_150,"cn-hangzhou",(allocator<char> *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              (local_170,"my_appid",(allocator<char> *)&resp);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"my_secret",&local_1b9);
    this = (PushRevertRpcRequestType *)
           aliyun::Push::CreatePushClient(local_150,local_170,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_150);
    if (this == (PushRevertRpcRequestType *)0x0) {
      std::__cxx11::string::~string((string *)&resp_1);
      aliyun::PushPushByteMessageRequestType::~PushPushByteMessageRequestType
                ((PushPushByteMessageRequestType *)&req);
      req.devices._M_string_length = 0;
      req.devices.field_2._M_local_buf[0] = '\0';
      req.app_id._M_dataplus._M_p = (pointer)&req.app_id.field_2;
      req.app_id._M_string_length = 0;
      req.app_id.field_2._M_local_buf[0] = '\0';
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      local_68 = 0;
      resp_1.response_id._M_string_length = 0;
      local_60._M_local_buf[0] = '\0';
      resp_1.response_id.field_2._M_local_buf[0] = '\0';
      resp_1.response_id._M_dataplus._M_p = (pointer)paVar3;
      req.devices._M_dataplus._M_p = (pointer)paVar1;
      local_90._M_p = (pointer)&local_80;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::string<std::allocator<char>>
                (local_150,"cn-hangzhou",(allocator<char> *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>
                (local_170,"my_appid",(allocator<char> *)&resp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"my_secret",&local_1b9);
      this = (PushRevertRpcRequestType *)
             aliyun::Push::CreatePushClient(local_150,local_170,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_150);
      if (this == (PushRevertRpcRequestType *)0x0) {
        aliyun::PushRevertRpcResponseType::~PushRevertRpcResponseType
                  ((PushRevertRpcResponseType *)&resp_1);
        aliyun::PushRevertRpcRequestType::~PushRevertRpcRequestType
                  ((PushRevertRpcRequestType *)&req);
        return 0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"127.0.0.1:12234",(allocator<char> *)&resp);
      aliyun::Push::SetProxyHost((Push *)this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      if ((char)(this->device_id)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->device_id)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp,
                 "{  \"RpcCode\": \"RpcCode\",  \"ResponseContent\": \"ResponseContent\"}",
                 &local_1b9);
      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
      std::__cxx11::string::~string((string *)&resp);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.app_id);
      std::__cxx11::string::assign((char *)&local_90);
      std::__cxx11::string::assign((char *)&local_70);
      aliyun::Push::RevertRpc(this,(PushRevertRpcResponseType *)&req,(PushErrorInfo *)&resp_1);
      HttpTestListener::WaitComplete(this_00);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"127.0.0.1:12234",(allocator<char> *)&resp);
      aliyun::Push::SetProxyHost((Push *)this,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      if ((char)(this->device_id)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->device_id)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp,"{  \"ResponseId\": \"ResponseId\"}",&local_1b9);
      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
      std::__cxx11::string::~string((string *)&resp);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.app_id);
      std::__cxx11::string::assign((char *)&local_90);
      std::__cxx11::string::assign((char *)&local_70);
      std::__cxx11::string::assign((char *)&local_50);
      aliyun::Push::PushByteMessage
                ((Push *)this,(PushPushByteMessageRequestType *)&req,&resp_1,(PushErrorInfo *)0x0);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"127.0.0.1:12234",(allocator<char> *)&local_190);
    aliyun::Push::SetProxyHost((Push *)this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if ((char)(this->device_id)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->device_id)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,
               "{  \"DeviceInfos\": {    \"DeviceInfo\": [      {        \"DeviceId\": \"DeviceId\",        \"IsOnline\": true,        \"Status\": 0      }    ]  }}"
               ,&local_1b9);
    HttpTestListener::SetResponseBody(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.app_id);
    aliyun::Push::BatchGetDevicesInfo
              ((PushBatchGetDevicesInfoRequestType *)this,
               (PushBatchGetDevicesInfoResponseType *)&req,(PushErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::Push::~Push((Push *)this);
  operator_delete(this,0x38);
  std::__cxx11::string::~string((string *)&resp_1);
  aliyun::PushPushByteMessageRequestType::~PushPushByteMessageRequestType
            ((PushPushByteMessageRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_batch_get_devices_info();
  test_push_byte_message();
  test_revert_rpc();
}